

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracy_concurrentqueue.h
# Opt level: O0

Block * __thiscall
tracy::moodycamel::
ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
requisition_block(ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>
                  *this)

{
  Block *block;
  ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits> *this_local;
  
  this_local = (ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits> *
               )try_get_block_from_initial_pool(this);
  if (((Block *)this_local == (Block *)0x0) &&
     (this_local = (ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>
                    *)try_get_block_from_free_list(this), (Block *)this_local == (Block *)0x0)) {
    this_local = (ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>
                  *)ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>
                    ::
                    create<tracy::moodycamel::ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>::Block>
                              ();
  }
  return (Block *)this_local;
}

Assistant:

Block* requisition_block()
	{
		auto block = try_get_block_from_initial_pool();
		if (block != nullptr) {
			return block;
		}

		block = try_get_block_from_free_list();
		if (block != nullptr) {
			return block;
		}

		return create<Block>();
	}